

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  char *pcVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  idx_t iVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  idx_t iVar17;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) && (count != 0)) {
      puVar2 = (ushort *)input->data;
      pbVar3 = *(byte **)states->data;
      bVar11 = *pbVar3;
      do {
        if ((bVar11 & 1) == 0) {
          *(ushort *)(pbVar3 + 2) = *puVar2;
          *pbVar3 = 1;
          bVar11 = 1;
        }
        else {
          *(ushort *)(pbVar3 + 2) = *(ushort *)(pbVar3 + 2) ^ *puVar2;
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    pdVar5 = states->data;
    FlatVector::VerifyFlatVector(input);
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar10 = 0;
        do {
          pcVar7 = *(char **)(pdVar5 + iVar10 * 8);
          if (*pcVar7 == '\0') {
            *(ushort *)(pcVar7 + 2) = *(ushort *)(pdVar4 + iVar10 * 2);
            *pcVar7 = '\x01';
          }
          else {
            *(ushort *)(pcVar7 + 2) = *(ushort *)(pcVar7 + 2) ^ *(ushort *)(pdVar4 + iVar10 * 2);
          }
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar12 = 0;
      uVar13 = 0;
      do {
        uVar6 = puVar1[uVar12];
        uVar15 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar15 = count;
        }
        uVar14 = uVar15;
        if (uVar6 != 0) {
          uVar14 = uVar13;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar13 < uVar15) {
              do {
                pcVar7 = *(char **)(pdVar5 + uVar14 * 8);
                if (*pcVar7 == '\0') {
                  *(ushort *)(pcVar7 + 2) = *(ushort *)(pdVar4 + uVar14 * 2);
                  *pcVar7 = '\x01';
                }
                else {
                  *(ushort *)(pcVar7 + 2) =
                       *(ushort *)(pcVar7 + 2) ^ *(ushort *)(pdVar4 + uVar14 * 2);
                }
                uVar14 = uVar14 + 1;
              } while (uVar15 != uVar14);
            }
          }
          else if (uVar13 < uVar15) {
            uVar14 = 0;
            do {
              if ((uVar6 >> (uVar14 & 0x3f) & 1) != 0) {
                pcVar7 = *(char **)(pdVar5 + uVar14 * 8 + uVar13 * 8);
                if (*pcVar7 == '\0') {
                  *(ushort *)(pcVar7 + 2) = *(ushort *)(pdVar4 + uVar14 * 2 + uVar13 * 2);
                  *pcVar7 = '\x01';
                }
                else {
                  *(ushort *)(pcVar7 + 2) =
                       *(ushort *)(pcVar7 + 2) ^ *(ushort *)(pdVar4 + uVar14 * 2 + uVar13 * 2);
                }
              }
              uVar14 = uVar14 + 1;
            } while ((uVar13 - uVar15) + uVar14 != 0);
            uVar14 = uVar13 + uVar14;
          }
        }
        uVar12 = uVar12 + 1;
        uVar13 = uVar14;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_b8);
    Vector::ToUnifiedFormat(states,count,&local_70);
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar8 = (local_b8.sel)->sel_vector;
        psVar9 = (local_70.sel)->sel_vector;
        iVar10 = 0;
        do {
          iVar16 = iVar10;
          if (psVar8 != (sel_t *)0x0) {
            iVar16 = (idx_t)psVar8[iVar10];
          }
          iVar17 = iVar10;
          if (psVar9 != (sel_t *)0x0) {
            iVar17 = (idx_t)psVar9[iVar10];
          }
          pcVar7 = *(char **)(local_70.data + iVar17 * 8);
          if (*pcVar7 == '\0') {
            *(ushort *)(pcVar7 + 2) = *(ushort *)(local_b8.data + iVar16 * 2);
            *pcVar7 = '\x01';
          }
          else {
            *(ushort *)(pcVar7 + 2) =
                 *(ushort *)(pcVar7 + 2) ^ *(ushort *)(local_b8.data + iVar16 * 2);
          }
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
      }
    }
    else if (count != 0) {
      psVar8 = (local_b8.sel)->sel_vector;
      psVar9 = (local_70.sel)->sel_vector;
      iVar10 = 0;
      do {
        iVar16 = iVar10;
        if (psVar8 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar8[iVar10];
        }
        iVar17 = iVar10;
        if (psVar9 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar9[iVar10];
        }
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar16 >> 6]
             >> (iVar16 & 0x3f) & 1) != 0) {
          pcVar7 = *(char **)(local_70.data + iVar17 * 8);
          if (*pcVar7 == '\0') {
            *(ushort *)(pcVar7 + 2) = *(ushort *)(local_b8.data + iVar16 * 2);
            *pcVar7 = '\x01';
          }
          else {
            *(ushort *)(pcVar7 + 2) =
                 *(ushort *)(pcVar7 + 2) ^ *(ushort *)(local_b8.data + iVar16 * 2);
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}